

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

shared_ptr<lf::refinement::MeshHierarchy> __thiscall
lf::refinement::GenerateMeshHierarchyByUniformRefinemnt
          (refinement *this,shared_ptr<lf::mesh::Mesh> *mesh_p,size_type ref_lev,RefPat ref_pat)

{
  bool bVar1;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<lf::refinement::MeshHierarchy> sVar2;
  uint local_2b4;
  uint refstep;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_2a8;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  mesh_factory_ptr;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  RefPat local_20;
  size_type local_1c;
  RefPat ref_pat_local;
  size_type ref_lev_local;
  shared_ptr<lf::mesh::Mesh> *mesh_p_local;
  shared_ptr<lf::refinement::MeshHierarchy> *multi_mesh_p;
  
  local_20 = ref_pat;
  local_1c = ref_lev;
  _ref_pat_local = mesh_p;
  mesh_p_local = (shared_ptr<lf::mesh::Mesh> *)this;
  bVar1 = std::operator==(mesh_p,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_2a8);
    std::
    make_shared<lf::refinement::MeshHierarchy,std::shared_ptr<lf::mesh::Mesh>const&,std::unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>>>
              ((shared_ptr<lf::mesh::Mesh> *)this,
               (unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                *)_ref_pat_local);
    for (local_2b4 = 0; local_2b4 < local_1c; local_2b4 = local_2b4 + 1) {
      this_00 = std::
                __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      MeshHierarchy::RefineRegular(this_00,local_20);
    }
    std::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
    ::~unique_ptr(&local_2a8);
    sVar2.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar2.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<lf::refinement::MeshHierarchy>)
           sVar2.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"No valid mesh supplied!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"mesh_p != nullptr",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x780,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"",
             (allocator<char> *)
             ((long)&mesh_factory_ptr._M_t.
                     super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl +
             7));
  lf::base::AssertionFailed(&local_248,&local_270,0x780,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mesh_factory_ptr._M_t.
                     super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl +
             7));
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

std::shared_ptr<MeshHierarchy> GenerateMeshHierarchyByUniformRefinemnt(
    const std::shared_ptr<lf::mesh::Mesh> &mesh_p, lf::base::size_type ref_lev,
    RefPat ref_pat) {
  LF_ASSERT_MSG(mesh_p != nullptr, "No valid mesh supplied!");
  // Set up the builder object for mesh entities, here suitable for a 2D
  // hybrid mesh comprising triangles and quadrilaterals
  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  // Create a mesh hierarchy with a single level
  std::shared_ptr<MeshHierarchy> multi_mesh_p =
      std::make_shared<MeshHierarchy>(mesh_p, std::move(mesh_factory_ptr));
  // Perform the desired number of steps of uniform refinement
  for (unsigned refstep = 0; refstep < ref_lev; ++refstep) {
    // Conduct regular refinement of all cells of the currently finest mesh.
    // This adds another mesh to the sequence of meshes.
    multi_mesh_p->RefineRegular(ref_pat);
  }
  return multi_mesh_p;
}